

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyDistributionEdgeCalculator.cpp
# Opt level: O2

int __thiscall
AnyDistributionEdgeCalculator::computeAllowableInsertSizeDiff(AnyDistributionEdgeCalculator *this)

{
  int iVar1;
  pointer pdVar2;
  reference pvVar3;
  pointer pdVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  vector<double,_std::allocator<double>_> *this_00;
  ulong __n;
  allocator_type local_59;
  double local_58;
  vector<double,_std::allocator<double>_> diff_dist;
  value_type_conflict4 local_38;
  
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&diff_dist,
             (long)(this->insert_size_dist->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->insert_size_dist->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2,&local_38,&local_59);
  this_00 = this->insert_size_dist;
  pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = 0;
  while (__n = uVar6, __n < (ulong)((long)pdVar2 - (long)pdVar4 >> 3)) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
    local_58 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::at(this->insert_size_dist,__n);
    *diff_dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = local_58 * *pvVar3 +
                *diff_dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    lVar7 = 1;
    while( true ) {
      this_00 = this->insert_size_dist;
      pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar6 = __n + 1;
      if ((ulong)((long)pdVar2 - (long)pdVar4 >> 3) <= __n + lVar7) break;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
      local_58 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::at(this->insert_size_dist,__n + lVar7);
      diff_dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar7] =
           local_58 * *pvVar3 + local_58 * *pvVar3 +
           diff_dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7];
      lVar7 = lVar7 + 1;
    }
  }
  iVar1 = (int)((ulong)((long)diff_dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)diff_dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  for (uVar5 = iVar1 - 2; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
    diff_dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar5] =
         diff_dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[(ulong)uVar5 + 1] +
         diff_dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5];
  }
  uVar6 = 1;
  do {
    if ((long)iVar1 <= (long)uVar6) {
LAB_00183014:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&diff_dist.super__Vector_base<double,_std::allocator<double>_>);
      return (int)uVar6;
    }
    if (diff_dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] <= this->significance_level &&
        this->significance_level !=
        diff_dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6]) {
      uVar6 = (ulong)((int)uVar6 - 1);
      goto LAB_00183014;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int AnyDistributionEdgeCalculator::computeAllowableInsertSizeDiff() {
	// first compute distribution of (absolute) differences of two independently sampled insert lengths
	vector<double> diff_dist(2*insert_size_dist->size(), 0.0);
	for (size_t i=0; i<insert_size_dist->size(); ++i) {
		diff_dist[0] += insert_size_dist->at(i) * insert_size_dist->at(i);
		for (size_t j=i+1; j<insert_size_dist->size(); ++j) {
			diff_dist[j-i] += 2 * (insert_size_dist->at(i) * insert_size_dist->at(j));
		}
	}
	// compute right-cumulative distribution
	for (int i=diff_dist.size()-2; i>=0; --i) {
		diff_dist[i] += diff_dist[i+1];
	}
	// determine largest difference k such that P(diff >= k) >= significance_level
	for (int k=1; k < (int)diff_dist.size(); ++k) {
		if (diff_dist[k] < significance_level) return k-1;
	}
	assert(false);
}